

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_evaluate_nurbs.cpp
# Opt level: O0

bool ON_EvaluateNurbsNonRationalSpan
               (int dim,int order,double *knot,int cv_stride,double *cv,int der_count,double t,
               int v_stride,double *v)

{
  double dVar1;
  ulong sz;
  void **local_280;
  size_t sizeof_buffer;
  void *heap_buffer;
  double stack_buffer [64];
  double a;
  double *N;
  int local_48;
  int k;
  int j;
  int i;
  int cv_len;
  int stride_minus_dim;
  double t_local;
  double *pdStack_28;
  int der_count_local;
  double *cv_local;
  int cv_stride_local;
  double *knot_local;
  int order_local;
  int dim_local;
  
  sizeof_buffer = 0;
  sz = (long)(order * order) << 3;
  if (sz < 0x201) {
    local_280 = &heap_buffer;
  }
  else {
    local_280 = (void **)onmalloc(sz);
    sizeof_buffer = (size_t)local_280;
  }
  a = (double)local_280;
  if (cv_stride - dim < 1) {
    memset(v,0,(long)((der_count + 1) * v_stride) << 3);
  }
  else {
    k = der_count + 1;
    while (k != 0) {
      memset(v,0,(long)dim << 3);
      v = v + v_stride;
      k = k + -1;
    }
    v = v + -(long)((der_count + 1) * v_stride);
  }
  t_local._4_4_ = der_count;
  if (order <= der_count) {
    t_local._4_4_ = order + -1;
  }
  ON_EvaluateNurbsBasis(order,knot,t,(double *)local_280);
  if (t_local._4_4_ != 0) {
    ON_EvaluateNurbsBasisDerivatives(order,knot,t_local._4_4_,(double *)local_280);
  }
  pdStack_28 = cv;
  for (k = 0; k <= t_local._4_4_; k = k + 1) {
    for (local_48 = 0; local_48 < order; local_48 = local_48 + 1) {
      dVar1 = *(double *)((long)a + (long)local_48 * 8);
      for (N._4_4_ = 0; N._4_4_ < dim; N._4_4_ = N._4_4_ + 1) {
        *v = dVar1 * *pdStack_28 + *v;
        v = v + 1;
        pdStack_28 = pdStack_28 + 1;
      }
      v = v + -(long)dim;
      pdStack_28 = pdStack_28 + (cv_stride - dim);
    }
    pdStack_28 = pdStack_28 + -(long)(cv_stride * order);
    v = v + v_stride;
    a = (double)((long)a + (long)order * 8);
  }
  if (order == 2) {
    local_48 = cv_stride;
    for (k = 0; k < dim; k = k + 1) {
      if ((pdStack_28[k] == pdStack_28[local_48]) &&
         (!NAN(pdStack_28[k]) && !NAN(pdStack_28[local_48]))) {
        v[(long)k - (long)((t_local._4_4_ + 1) * v_stride)] = pdStack_28[k];
      }
      local_48 = local_48 + 1;
    }
  }
  if (sizeof_buffer != 0) {
    onfree((void *)sizeof_buffer);
  }
  return true;
}

Assistant:

static
bool ON_EvaluateNurbsNonRationalSpan( 
                  int dim,             // dimension
                  int order,           // order
                  const double* knot,  // knot[] array of (2*order-2) doubles
                  int cv_stride,       // cv_stride >= (is_rat)?dim+1:dim
                  const double* cv,    // cv[order*cv_stride] array
                  int der_count,       // number of derivatives to compute
                  double t,            // evaluation parameter
                  int v_stride,        // v_stride (>=dimension)
                  double* v            // v[(der_count+1)*v_stride] array
                  )
{
  const int stride_minus_dim = cv_stride - dim;
  const int cv_len = cv_stride*order;
  int i, j, k;
  double *N;
	double a;

  double stack_buffer[64];
  void* heap_buffer = 0;
  const size_t sizeof_buffer = (order*order)*sizeof(*N);

	N = (sizeof_buffer <= sizeof(stack_buffer)) ? stack_buffer : (double*)(heap_buffer=onmalloc(sizeof_buffer));

  if ( stride_minus_dim > 0)
  {
    i = (der_count+1);
    while( i--)
    {
      memset(v,0,dim*sizeof(v[0]));
      v += v_stride;
    }
    v -= ((der_count+1)*v_stride);
  }
  else
  {
    memset( v, 0, (der_count+1)*v_stride*sizeof(*v) );
  }

  if ( der_count >= order )
    der_count = order-1;

	// evaluate basis functions
	ON_EvaluateNurbsBasis( order, knot, t, N );
	if ( der_count ) 
		ON_EvaluateNurbsBasisDerivatives( order, knot, der_count, N );

	// convert cv's into answers
	for (i = 0; i <= der_count; i++, v += v_stride, N += order) {
    for ( j = 0; j < order; j++ ) {
      a = N[j];
      for ( k = 0; k < dim; k++ ) {
        *v++ += a* *cv++;
      }
      v -= dim;
      cv += stride_minus_dim;
    }
    cv -= cv_len;
	}

  if ( 2 == order )
  {
    // 7 January 2004  Dale Lear
    //    Added to fix those cases when, numerically, t*a + (1.0-t)*a != a.
    //    Similar to fix for RR 9683.
    v -= (der_count+1)*v_stride;
    j = cv_stride;
    for ( i = 0; i < dim; i++, j++ )
    {
      if (cv[i] == cv[j] )
        v[i] = cv[i];
    }
  }

  if ( 0 != heap_buffer )
    onfree(heap_buffer);
		
	return true;
}